

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

int soplex::LPFreadColName<double>
              (char **pos,NameSet *colnames,LPColSetBase<double> *colset,LPColBase<double> *emptycol
              ,SPxOut *spxout)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  ostream *poVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  Verbosity old_verbosity;
  char name [8192];
  DataKey local_2040;
  char local_2038 [8200];
  
  pcVar9 = *pos + -1;
  do {
    cVar2 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
    pvVar6 = memchr("+-.<>= ",(int)cVar2,8);
    if (pvVar6 != (void *)0x0) break;
  } while (cVar2 != '\0');
  pcVar3 = *pos;
  if (pcVar9 == pcVar3) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      pcVar1 = pcVar3 + uVar8;
      local_2038[uVar8] = *pcVar1;
      uVar8 = uVar8 + 1;
      *pos = pcVar1 + 1;
    } while (pcVar9 != pcVar1 + 1);
    uVar8 = uVar8 & 0xffffffff;
  }
  local_2038[uVar8] = '\0';
  iVar5 = NameSet::number(colnames,local_2038);
  if (iVar5 < 0) {
    if (emptycol == (LPColBase<double> *)0x0) {
      if ((spxout != (SPxOut *)0x0) && (0 < (int)spxout->m_verbosity)) {
        local_2040.info = spxout->m_verbosity;
        (*spxout->_vptr_SPxOut[2])(spxout);
        std::__ostream_insert<char,std::char_traits<char>>
                  (spxout->m_streams[spxout->m_verbosity],"WLPFRD02 Unknown variable \"",0x1b);
        poVar4 = spxout->m_streams[spxout->m_verbosity];
        sVar7 = strlen(local_2038);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2038,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (spxout->m_streams[spxout->m_verbosity],"\" ",2);
        (*spxout->_vptr_SPxOut[2])(spxout,&local_2040);
      }
    }
    else {
      iVar5 = (colnames->set).thenum;
      NameSet::add(colnames,local_2038);
      local_2040.info = 0;
      local_2040.idx = -1;
      LPColSetBase<double>::add(colset,&local_2040,emptycol);
    }
  }
  uVar8 = (ulong)(byte)**pos;
  if ((uVar8 < 0x21) && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0)) {
    *pos = *pos + 1;
  }
  return iVar5;
}

Assistant:

static int LPFreadColName(char*& pos, NameSet* colnames, LPColSetBase<R>& colset,
                          const LPColBase<R>* emptycol, SPxOut* spxout)
{
   assert(LPFisColName(pos));
   assert(colnames != nullptr);

   char        name[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   int         i;
   int         colidx;

   // These are the characters that are not allowed in a column name.
   while((strchr("+-.<>= ", *s) == nullptr) && (*s != '\0'))
      s++;

   for(i = 0; pos != s; i++, pos++)
      name[i] = *pos;

   name[i] = '\0';

   if((colidx = colnames->number(name)) < 0)
   {
      // We only add the name if we got an empty column.
      if(emptycol == nullptr)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD02 Unknown variable \"" << name << "\" ";)
      }
      else
      {
         colidx = colnames->num();
         colnames->add(name);
         colset.add(*emptycol);
      }
   }

   SPxOut::debug(spxout, "DLPFRD03 LPFreadColName [{}] = {}\n", name, colidx);

   if(LPFisSpace(*pos))
      pos++;

   return colidx;
}